

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

void Acec_CheckBoothPPs(Gia_Man_t *p,Vec_Wec_t *vLitLeaves)

{
  int iVar1;
  int v;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar2;
  uint i;
  int CountB;
  ulong uVar3;
  int CountPI;
  ulong uVar4;
  int i_00;
  int CountNB;
  uint local_48;
  
  p_00 = Acec_MultMarkPPs(p);
  for (i = 0; (int)i < vLitLeaves->nSize; i = i + 1) {
    p_01 = Vec_WecEntry(vLitLeaves,i);
    i_00 = 0;
    uVar4 = 0;
    uVar3 = 0;
    local_48 = 0;
    while( true ) {
      if (p_01->nSize <= i_00) break;
      iVar1 = Vec_IntEntry(p_01,i_00);
      v = Abc_Lit2Var(iVar1);
      pGVar2 = Gia_ManObj(p,v);
      if ((int)*(uint *)pGVar2 < 0 || (~*(uint *)pGVar2 & 0x1fffffff) == 0) {
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      else {
        iVar1 = Abc_Lit2Var(iVar1);
        iVar1 = Vec_BitEntry(p_00,iVar1);
        if (iVar1 == 0) {
          local_48 = local_48 + 1;
        }
        else {
          uVar3 = (ulong)((int)uVar3 + 1);
        }
      }
      i_00 = i_00 + 1;
    }
    printf("Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n",(ulong)i,
           (ulong)(uint)p_01->nSize,uVar4,uVar3,(ulong)local_48);
  }
  Vec_BitFree(p_00);
  return;
}

Assistant:

void Acec_CheckBoothPPs( Gia_Man_t * p, Vec_Wec_t * vLitLeaves )
{
    Vec_Bit_t * vMarked = Acec_MultMarkPPs( p );
    Vec_Int_t * vLevel;
    int i, k, iLit;
    Vec_WecForEachLevel( vLitLeaves, vLevel, i )
    {
        int CountPI = 0, CountB = 0, CountNB = 0;
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                CountPI++;
            else if ( Vec_BitEntry( vMarked, Abc_Lit2Var(iLit) ) )
                CountB++;
            else
                CountNB++;

        printf( "Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n", i, Vec_IntSize(vLevel), CountPI, CountB, CountNB );
    }
    Vec_BitFree( vMarked );
}